

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_decode_1(dwt_t *v)

{
  undefined8 *in_RDI;
  
  dwt_decode_1_((int *)*in_RDI,*(int *)(in_RDI + 1),*(int *)((long)in_RDI + 0xc),
                *(int *)(in_RDI + 2));
  return;
}

Assistant:

static void dwt_decode_1(dwt_t *v) {
	dwt_decode_1_(v->mem, v->dn, v->sn, v->cas);
}